

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  byte bVar1;
  unsigned_long uVar2;
  NAMED *pNVar3;
  NAMED **ppNVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  
  if (table->size == 0) {
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    table->power = '\x06';
    table->size = 0x40;
    ppNVar4 = (NAMED **)(*table->mem->malloc_fcn)(0x200);
    table->v = ppNVar4;
    if (ppNVar4 == (NAMED **)0x0) {
      table->size = 0;
      return (NAMED *)0x0;
    }
    memset(ppNVar4,0,0x200);
    uVar2 = hash(parser,name);
    uVar14 = table->size - 1 & uVar2;
  }
  else {
    uVar2 = hash(parser,name);
    sVar13 = table->size;
    bVar11 = 0;
    for (uVar14 = sVar13 - 1 & uVar2; pNVar3 = table->v[uVar14], pNVar3 != (NAMED *)0x0;
        uVar14 = (uVar14 - bVar11) + sVar10) {
      for (lVar12 = 0; name[lVar12] == pNVar3->name[lVar12]; lVar12 = lVar12 + 1) {
        if (name[lVar12] == '\0') {
          return pNVar3;
        }
      }
      if (bVar11 == 0) {
        bVar11 = (byte)((-sVar13 & uVar2) >> ((char)*(undefined4 *)&table->power - 1U & 0x3f)) &
                 (byte)(sVar13 - 1 >> 2) | 1;
      }
      sVar10 = 0;
      if (uVar14 < bVar11) {
        sVar10 = sVar13;
      }
    }
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    bVar11 = (byte)*(undefined4 *)&table->power;
    if (table->used >> (bVar11 - 1 & 0x3f) != 0) {
      bVar8 = bVar11 + 1;
      if (0x3f < bVar8) {
        return (NAMED *)0x0;
      }
      sVar13 = 1L << (bVar8 & 0x3f);
      if (0x3c < bVar8) {
        return (NAMED *)0x0;
      }
      sVar10 = 8L << (bVar8 & 0x3f);
      ppNVar4 = (NAMED **)(*table->mem->malloc_fcn)(sVar10);
      if (ppNVar4 == (NAMED **)0x0) {
        return (NAMED *)0x0;
      }
      uVar14 = sVar13 - 1;
      memset(ppNVar4,0,sVar10);
      for (uVar7 = 0; bVar1 = (byte)(uVar14 >> 2), uVar7 < table->size; uVar7 = uVar7 + 1) {
        if (table->v[uVar7] != (NAMED *)0x0) {
          uVar5 = hash(parser,table->v[uVar7]->name);
          uVar6 = 0;
          for (uVar9 = uVar5 & uVar14; ppNVar4[uVar9] != (NAMED *)0x0;
              uVar9 = (uVar9 - uVar6) + sVar10) {
            if ((char)uVar6 == '\0') {
              uVar6 = (ulong)(byte)(bVar1 & (byte)((uVar5 & -sVar13) >> (bVar11 & 0x3f)) | 1);
            }
            sVar10 = 0;
            if (uVar9 < uVar6) {
              sVar10 = sVar13;
            }
          }
          ppNVar4[uVar9] = table->v[uVar7];
        }
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar4;
      table->power = bVar8;
      table->size = sVar13;
      uVar7 = 0;
      for (uVar14 = uVar14 & uVar2; ppNVar4[uVar14] != (NAMED *)0x0;
          uVar14 = (uVar14 - uVar7) + sVar10) {
        if ((char)uVar7 == '\0') {
          uVar7 = (ulong)(byte)(bVar1 & (byte)((-sVar13 & uVar2) >> (bVar11 & 0x3f)) | 1);
        }
        sVar10 = 0;
        if (uVar14 < uVar7) {
          sVar10 = sVar13;
        }
      }
    }
  }
  pNVar3 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[uVar14] = pNVar3;
  if (table->v[uVar14] == (NAMED *)0x0) {
    return (NAMED *)0x0;
  }
  memset(table->v[uVar14],0,createSize);
  ppNVar4 = table->v;
  ppNVar4[uVar14]->name = name;
  table->used = table->used + 1;
  return ppNVar4[uVar14];
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize) {
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (! createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = table->mem->malloc_fcn(tsize);
    if (! table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  } else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (! step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (! createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;

      /* Detect and prevent invalid shift */
      if (newPower >= sizeof(unsigned long) * 8 /* bits per byte */) {
        return NULL;
      }

      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;

      /* Detect and prevent integer overflow */
      if (newSize > (size_t)(-1) / sizeof(NAMED *)) {
        return NULL;
      }

      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = table->mem->malloc_fcn(tsize);
      if (! newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (! step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (! step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = table->mem->malloc_fcn(createSize);
  if (! table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}